

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitQueryExtensions
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t name_offset,uint8_t *client_addr,
          size_t client_addr_length)

{
  uint32_t uVar1;
  TldAsKey *pTVar2;
  undefined1 local_b0 [8];
  TldAsKey key;
  bool is_numeric;
  bool is_bad_syntax;
  bool is_binary;
  bool gotTld;
  uint32_t previous_offset;
  int nb_name_parts;
  uint32_t tld_offset;
  size_t client_addr_length_local;
  uint8_t *client_addr_local;
  uint32_t name_offset_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  previous_offset = 0;
  _is_numeric = 0;
  key.hash = 0;
  _nb_name_parts = client_addr_length;
  client_addr_length_local = (size_t)client_addr;
  client_addr_local._0_4_ = name_offset;
  client_addr_local._4_4_ = length;
  _name_offset_local = packet;
  packet_local = (uint8_t *)this;
  key.count._3_1_ = GetTLD(packet,length,name_offset,&previous_offset,&key.hash,(int *)&is_numeric);
  if ((bool)key.count._3_1_) {
    key.count._2_1_ = 0;
    key.count._1_1_ = 0;
    key.count._0_1_ = 0;
    TldCheck(_name_offset_local + (ulong)previous_offset + 1,
             (ulong)_name_offset_local[previous_offset],(bool *)((long)&key.count + 2),
             (bool *)((long)&key.count + 1),(bool *)&key.count);
    if (((key.count._2_1_ & 1) == 0) && ((key.count._1_1_ & 1) == 0)) {
      SetToUpperCase(_name_offset_local + (ulong)previous_offset + 1,
                     (ulong)_name_offset_local[previous_offset]);
      TldAsKey::TldAsKey((TldAsKey *)local_b0,_name_offset_local + (ulong)previous_offset + 1,
                         (ulong)_name_offset_local[previous_offset]);
      uVar1 = BinHash<TldAsKey>::GetCount(&this->registeredTld);
      if (uVar1 == 0) {
        LoadRegisteredTLD_from_memory(this);
      }
      pTVar2 = BinHash<TldAsKey>::Retrieve(&this->registeredTld,(TldAsKey *)local_b0);
      if (pTVar2 != (TldAsKey *)0x0) {
        RegisterOptionsByIp(this,(uint8_t *)client_addr_length_local,_nb_name_parts);
      }
      TldAsKey::~TldAsKey((TldAsKey *)local_b0);
    }
  }
  return;
}

Assistant:

void DnsStats::SubmitQueryExtensions(
    uint8_t* packet, uint32_t length, uint32_t name_offset,
    uint8_t* client_addr, size_t client_addr_length)
{
    uint32_t tld_offset = 0;
    int nb_name_parts = 0;
    uint32_t previous_offset = 0;
    bool gotTld = GetTLD(packet, length, name_offset, &tld_offset, &previous_offset, &nb_name_parts);

    if (gotTld)
    {
        bool is_binary = false;
        bool is_bad_syntax = false;
        bool is_numeric = false;

        /* Verify that the TLD is valid, so as to exclude random traffic that would drown the stats */
        TldCheck(packet + tld_offset + 1, packet[tld_offset], &is_binary, &is_bad_syntax, &is_numeric);

        if (!is_binary && !is_bad_syntax) {
            SetToUpperCase(packet + tld_offset + 1, packet[tld_offset]);
            TldAsKey key(packet + tld_offset + 1, packet[tld_offset]);

            if (registeredTld.GetCount() == 0)
            {
                LoadRegisteredTLD_from_memory();
            }

            if (registeredTld.Retrieve(&key) != NULL)
            {
                /* This is a registered TLD
                 * Use the list of source addresses as a filter to
                 * check the incoming EDNS options */
                RegisterOptionsByIp(client_addr, client_addr_length);
            }
        }
    }
}